

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_tools_enc.c
# Opt level: O1

void WebPCleanupTransparentArea(WebPPicture *pic)

{
  uint *puVar1;
  uint32_t *puVar2;
  int iVar3;
  uint32_t *puVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int *piVar10;
  uint8_t *puVar11;
  bool bVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  byte bVar18;
  uint32_t uVar19;
  uint uVar20;
  int iVar21;
  uint8_t *puVar22;
  uint32_t *puVar23;
  byte bVar24;
  long lVar25;
  byte *y_ptr;
  int iVar26;
  undefined1 auVar27 [16];
  int width;
  uint8_t *local_70;
  uint8_t *local_68;
  
  if (pic != (WebPPicture *)0x0) {
    iVar3 = pic->width;
    iVar13 = pic->height;
    iVar7 = iVar3 + 7;
    if (-1 < iVar3) {
      iVar7 = iVar3;
    }
    iVar9 = iVar13 + 7;
    if (-1 < iVar13) {
      iVar9 = iVar13;
    }
    if (pic->use_argb == 0) {
      puVar11 = pic->y;
      local_68 = pic->u;
      local_70 = pic->v;
      puVar22 = pic->a;
      auVar27._0_4_ = -(uint)((int)((ulong)puVar22 >> 0x20) == 0 && (int)puVar22 == 0);
      auVar27._4_4_ = -(uint)((int)puVar11 == 0 && (int)((ulong)puVar11 >> 0x20) == 0);
      auVar27._8_4_ = -(uint)((int)((ulong)local_68 >> 0x20) == 0 && (int)local_68 == 0);
      auVar27._12_4_ = -(uint)(*(int *)&pic->v == 0 && (int)((ulong)local_70 >> 0x20) == 0);
      iVar7 = movmskps(iVar7,auVar27);
      if (iVar7 == 0) {
        iVar7 = pic->y_stride;
        iVar9 = pic->a_stride;
        if (iVar13 < 8) {
          iVar14 = 0;
        }
        else {
          iVar21 = pic->uv_stride;
          uVar15 = 0;
          bVar24 = 0;
          bVar18 = 0;
          iVar8 = 8;
          do {
            iVar14 = iVar8;
            if (iVar3 < 8) {
              uVar20 = 0;
            }
            else {
              bVar12 = true;
              uVar17 = 0;
              uVar6 = 8;
              do {
                uVar20 = uVar6;
                y_ptr = puVar11 + uVar17;
                iVar8 = SmoothenBlock(puVar22 + uVar17,iVar9,y_ptr,iVar7,8,8);
                if (iVar8 == 0) {
                  bVar12 = true;
                }
                else {
                  if (bVar12) {
                    bVar18 = *y_ptr;
                    bVar24 = local_68[uVar17 >> 1];
                    uVar15 = (uint)local_70[uVar17 >> 1];
                  }
                  iVar8 = 8;
                  do {
                    *(ulong *)y_ptr = (ulong)bVar18 * 0x101010101010101;
                    y_ptr = y_ptr + iVar7;
                    iVar8 = iVar8 + -1;
                  } while (iVar8 != 0);
                  piVar10 = (int *)(local_68 + (uVar17 >> 1));
                  iVar8 = 4;
                  do {
                    *piVar10 = (uint)bVar24 * 0x1010101;
                    piVar10 = (int *)((long)piVar10 + (long)iVar21);
                    iVar8 = iVar8 + -1;
                  } while (iVar8 != 0);
                  piVar10 = (int *)(local_70 + (uVar17 >> 1));
                  iVar8 = 4;
                  do {
                    *piVar10 = uVar15 * 0x1010101;
                    piVar10 = (int *)((long)piVar10 + (long)iVar21);
                    iVar8 = iVar8 + -1;
                  } while (iVar8 != 0);
                  bVar12 = false;
                }
                uVar17 = uVar17 + 8;
                uVar6 = uVar20 + 8;
              } while ((int)(uVar20 + 8) <= iVar3);
            }
            if (iVar3 - uVar20 != 0 && (int)uVar20 <= iVar3) {
              SmoothenBlock(puVar22 + uVar20,iVar9,puVar11 + uVar20,iVar7,iVar3 - uVar20,8);
            }
            puVar22 = puVar22 + (long)iVar9 * 8;
            puVar11 = puVar11 + iVar7 * 8;
            local_68 = local_68 + iVar21 * 4;
            local_70 = local_70 + iVar21 * 4;
            iVar8 = iVar14 + 8;
          } while (iVar14 + 8 <= iVar13);
        }
        iVar21 = iVar13 - iVar14;
        if (iVar21 != 0 && iVar14 <= iVar13) {
          uVar17 = 0;
          if (7 < iVar3) {
            uVar16 = 0;
            do {
              SmoothenBlock(puVar22 + uVar16,iVar9,puVar11 + uVar16,iVar7,8,iVar21);
              uVar17 = uVar16 + 8;
              iVar13 = (int)uVar16;
              uVar16 = uVar17;
            } while (iVar13 + 0x10 <= iVar3);
          }
          iVar13 = iVar3 - (int)uVar17;
          if (iVar13 != 0 && (int)uVar17 <= iVar3) {
            SmoothenBlock(puVar22 + (uVar17 & 0xffffffff),iVar9,puVar11 + (uVar17 & 0xffffffff),
                          iVar7,iVar13,iVar21);
            return;
          }
        }
      }
    }
    else if (7 < iVar13) {
      iVar13 = 0;
      uVar19 = 0;
      do {
        if (7 < iVar3) {
          puVar4 = pic->argb;
          bVar12 = true;
          iVar21 = 0;
          do {
            iVar8 = pic->argb_stride;
            iVar14 = (iVar8 * iVar13 + iVar21) * 8;
            puVar23 = puVar4 + iVar14;
            iVar26 = 0;
            do {
              lVar25 = 0;
              do {
                puVar1 = puVar23 + lVar25;
                bVar5 = true;
                if (0xffffff < *puVar1) goto LAB_00137b1d;
                lVar25 = lVar25 + 1;
              } while (lVar25 != 8);
              iVar26 = iVar26 + 1;
              puVar23 = puVar23 + iVar8;
            } while (iVar26 != 8);
            if (*puVar1 < 0x1000000) {
              if (bVar12) {
                uVar19 = puVar4[iVar14];
              }
              puVar23 = puVar4 + iVar14;
              iVar14 = 0;
              do {
                lVar25 = 0;
                do {
                  puVar2 = puVar23 + lVar25;
                  *puVar2 = uVar19;
                  puVar2[1] = uVar19;
                  puVar2[2] = uVar19;
                  puVar2[3] = uVar19;
                  lVar25 = lVar25 + 4;
                } while (lVar25 != 8);
                iVar14 = iVar14 + 1;
                puVar23 = puVar23 + iVar8;
                bVar5 = false;
              } while (iVar14 != 8);
            }
LAB_00137b1d:
            bVar12 = bVar5;
            iVar21 = iVar21 + 1;
          } while (iVar21 != iVar7 >> 3);
        }
        iVar13 = iVar13 + 1;
      } while (iVar13 != iVar9 >> 3);
    }
  }
  return;
}

Assistant:

void WebPCleanupTransparentArea(WebPPicture* pic) {
  int x, y, w, h;
  if (pic == NULL) return;
  w = pic->width / SIZE;
  h = pic->height / SIZE;

  // note: we ignore the left-overs on right/bottom, except for SmoothenBlock().
  if (pic->use_argb) {
    uint32_t argb_value = 0;
    for (y = 0; y < h; ++y) {
      int need_reset = 1;
      for (x = 0; x < w; ++x) {
        const int off = (y * pic->argb_stride + x) * SIZE;
        if (IsTransparentARGBArea(pic->argb + off, pic->argb_stride, SIZE)) {
          if (need_reset) {
            argb_value = pic->argb[off];
            need_reset = 0;
          }
          FlattenARGB(pic->argb + off, argb_value, pic->argb_stride, SIZE);
        } else {
          need_reset = 1;
        }
      }
    }
  } else {
    const int width = pic->width;
    const int height = pic->height;
    const int y_stride = pic->y_stride;
    const int uv_stride = pic->uv_stride;
    const int a_stride = pic->a_stride;
    uint8_t* y_ptr = pic->y;
    uint8_t* u_ptr = pic->u;
    uint8_t* v_ptr = pic->v;
    const uint8_t* a_ptr = pic->a;
    int values[3] = { 0 };
    if (a_ptr == NULL || y_ptr == NULL || u_ptr == NULL || v_ptr == NULL) {
      return;
    }
    for (y = 0; y + SIZE <= height; y += SIZE) {
      int need_reset = 1;
      for (x = 0; x + SIZE <= width; x += SIZE) {
        if (SmoothenBlock(a_ptr + x, a_stride, y_ptr + x, y_stride,
                          SIZE, SIZE)) {
          if (need_reset) {
            values[0] = y_ptr[x];
            values[1] = u_ptr[x >> 1];
            values[2] = v_ptr[x >> 1];
            need_reset = 0;
          }
          Flatten(y_ptr + x,        values[0], y_stride,  SIZE);
          Flatten(u_ptr + (x >> 1), values[1], uv_stride, SIZE2);
          Flatten(v_ptr + (x >> 1), values[2], uv_stride, SIZE2);
        } else {
          need_reset = 1;
        }
      }
      if (x < width) {
        SmoothenBlock(a_ptr + x, a_stride, y_ptr + x, y_stride,
                      width - x, SIZE);
      }
      a_ptr += SIZE * a_stride;
      y_ptr += SIZE * y_stride;
      u_ptr += SIZE2 * uv_stride;
      v_ptr += SIZE2 * uv_stride;
    }
    if (y < height) {
      const int sub_height = height - y;
      for (x = 0; x + SIZE <= width; x += SIZE) {
        SmoothenBlock(a_ptr + x, a_stride, y_ptr + x, y_stride,
                      SIZE, sub_height);
      }
      if (x < width) {
        SmoothenBlock(a_ptr + x, a_stride, y_ptr + x, y_stride,
                      width - x, sub_height);
      }
    }
  }
}